

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

SearchResult *
search::search(SearchResult *__return_storage_ptr__,Position *pos,SearchGlobals *sg,int depth)

{
  array<search::SearchStack,_128UL> search_stack;
  SearchStack local_a28 [128];
  
  SearchStack::new_search_stack();
  search_impl(__return_storage_ptr__,pos,-0x7531,0x7531,depth,local_a28,sg);
  return __return_storage_ptr__;
}

Assistant:

SearchResult search(Position& pos, SearchGlobals& sg, int depth) {
    auto search_stack = SearchStack::new_search_stack();
    int alpha = -INFINITE;
    int beta = +INFINITE;
    SearchResult search_result = search_impl(pos, alpha, beta, depth, search_stack.begin(), sg);
    return search_result;
}